

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

mcpl_generic_wfilehandle_t *
mcpl_generic_wfopen(mcpl_generic_wfilehandle_t *__return_storage_ptr__,char *filename)

{
  FILE *pFVar1;
  
  __return_storage_ptr__->mode = 0;
  __return_storage_ptr__->current_pos = 0;
  pFVar1 = mcpl_internal_fopen(filename,"wb");
  __return_storage_ptr__->internal = pFVar1;
  if (pFVar1 != (FILE *)0x0) {
    return __return_storage_ptr__;
  }
  mcpl_error("Unable to open file for writing!");
}

Assistant:

mcpl_generic_wfilehandle_t mcpl_generic_wfopen( const char * filename )
{
  mcpl_generic_wfilehandle_t res;
  res.mode = 0;
  res.current_pos = 0;
  res.internal = NULL;
  res.internal = (void*)mcpl_internal_fopen(filename,"wb");
  if (!res.internal)
    mcpl_error("Unable to open file for writing!");
  return res;
}